

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O2

void object_absorb(object *obj1,object *obj2)

{
  int iVar1;
  object *obj;
  _Bool _Var2;
  uint8_t uVar3;
  int iVar4;
  object *known;
  object *local_20;
  object *local_18;
  
  obj = obj2->known;
  iVar4 = (uint)obj2->number + (uint)obj1->number;
  iVar1 = obj1->kind->base->max_stack;
  uVar3 = (uint8_t)iVar4;
  if (iVar1 <= iVar4) {
    uVar3 = (uint8_t)iVar1;
  }
  obj1->number = uVar3;
  local_20 = obj;
  local_18 = obj2;
  object_absorb_merge(obj1,obj2);
  if (obj != (object *)0x0) {
    _Var2 = loc_is_zero((loc_conflict)obj->grid);
    if (!_Var2) {
      square_excise_object((chunk_conflict *)player->cave,obj->grid,obj);
    }
    delist_object((chunk_conflict *)player->cave,obj);
    object_delete((chunk *)player->cave,(chunk *)0x0,&local_20);
  }
  object_delete((chunk *)cave,(chunk *)player->cave,&local_18);
  return;
}

Assistant:

void object_absorb(struct object *obj1, struct object *obj2)
{
	struct object *known = obj2->known;
	int total = obj1->number + obj2->number;

	/* Add together the item counts */
	obj1->number = MIN(total, obj1->kind->base->max_stack);

	object_absorb_merge(obj1, obj2);
	if (known) {
		if (!loc_is_zero(known->grid)) {
			square_excise_object(player->cave, known->grid, known);
		}
		delist_object(player->cave, known);
		object_delete(player->cave, NULL, &known);
	}
	object_delete(cave, player->cave, &obj2);
}